

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

int __thiscall QListModel::remove(QListModel *this,char *__filename)

{
  qsizetype qVar1;
  const_reference ppQVar2;
  long in_FS_OFFSET;
  int row;
  QListWidgetItem **in_stack_ffffffffffffffb8;
  undefined1 local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = __filename;
  if (__filename != (char *)0x0) {
    qVar1 = QListSpecialMethodsBase<QListWidgetItem*>::indexOf<QListWidgetItem*>
                      ((QListSpecialMethodsBase<QListWidgetItem_*> *)this,in_stack_ffffffffffffffb8,
                       0x89994e);
    QModelIndex::QModelIndex((QModelIndex *)0x89995c);
    QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)local_28,(int)qVar1);
    ppQVar2 = QList<QListWidgetItem_*>::at
                        ((QList<QListWidgetItem_*> *)this,(qsizetype)in_stack_ffffffffffffffb8);
    (*ppQVar2)->d->theid = -1;
    ppQVar2 = QList<QListWidgetItem_*>::at
                        ((QList<QListWidgetItem_*> *)this,(qsizetype)in_stack_ffffffffffffffb8);
    (*ppQVar2)->view = (QListWidget *)0x0;
    QList<QListWidgetItem_*>::removeAt
              ((QList<QListWidgetItem_*> *)this,(qsizetype)in_stack_ffffffffffffffb8);
    QAbstractItemModel::endRemoveRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QListModel::remove(QListWidgetItem *item)
{
    if (!item)
        return;
    int row = items.indexOf(item); // ### use index(item) - it's faster
    Q_ASSERT(row != -1);
    beginRemoveRows(QModelIndex(), row, row);
    items.at(row)->d->theid = -1;
    items.at(row)->view = nullptr;
    items.removeAt(row);
    endRemoveRows();
}